

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManCompare(Gia_Man_t *p1,Gia_Man_t *p2)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  char *__format;
  long lVar7;
  
  uVar1 = p1->nObjs;
  uVar2 = p2->nObjs;
  if (uVar1 == uVar2) {
    if (0 < (int)uVar1) {
      pGVar3 = p1->pObjs;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)&pGVar3->Value + lVar7) = 0;
        lVar7 = lVar7 + 0xc;
      } while ((ulong)uVar1 * 0xc != lVar7);
    }
    if (0 < (int)uVar2) {
      pGVar3 = p2->pObjs;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)&pGVar3->Value + lVar7) = 0;
        lVar7 = lVar7 + 0xc;
      } while ((ulong)uVar2 * 0xc != lVar7);
    }
    iVar6 = 1;
    if ((0 < (int)uVar1) && (pGVar3 = p1->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
      uVar4 = 0;
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar4;
      }
      do {
        if (uVar4 == uVar5) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar3[uVar4].Value != p2->pObjs[uVar4].Value ||
            *(long *)(pGVar3 + uVar4) != *(long *)(p2->pObjs + uVar4)) {
          __format = "Objects %d are different.\n";
LAB_00243885:
          printf(__format,uVar4 & 0xffffffff);
          return 0;
        }
        if (((p1->pReprs != (Gia_Rpr_t *)0x0) && (p2->pReprs != (Gia_Rpr_t *)0x0)) &&
           (p1->pReprs[uVar4] != p2->pReprs[uVar4])) {
          __format = "Representatives of objects %d are different.\n";
          goto LAB_00243885;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
  }
  else {
    puts("AIGs have different number of objects.");
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Gia_ManCompare( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Obj_t * pObj1, * pObj2;
    int i;
    if ( Gia_ManObjNum(p1) != Gia_ManObjNum(p2) )
    {
        printf( "AIGs have different number of objects.\n" );
        return 0;
    }
    Gia_ManCleanValue( p1 );
    Gia_ManCleanValue( p2 );
    Gia_ManForEachObj( p1, pObj1, i )
    {
        pObj2 = Gia_ManObj( p2, i );
        if ( memcmp( pObj1, pObj2, sizeof(Gia_Obj_t) ) )
        {
            printf( "Objects %d are different.\n", i );
            return 0;
        }
        if ( p1->pReprs && p2->pReprs )
        {
            if ( memcmp( &p1->pReprs[i], &p2->pReprs[i], sizeof(Gia_Rpr_t) ) )
            {
                printf( "Representatives of objects %d are different.\n", i );
                return 0;
            }
        }
    }
    return 1;
}